

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O2

string * __thiscall Response::prepare_url(string *__return_storage_ptr__,Response *this,string *url)

{
  long lVar1;
  Response *this_00;
  string asStack_38 [32];
  
  lVar1 = std::__cxx11::string::find((char *)url,0x10970b);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)asStack_38,(ulong)url);
    std::__cxx11::string::operator=((string *)url,asStack_38);
    std::__cxx11::string::~string(asStack_38);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = (Response *)__return_storage_ptr__;
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  decode_url(this_00,(iterator)(__return_storage_ptr__->_M_dataplus)._M_p,(url->_M_dataplus)._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::string Response::prepare_url(std::string url) const  {
    const unsigned long pos = url.find("?");
    if (pos != std::string::npos) {
        url = url.substr(0, pos);
    }

    std::string decoded_filepath;
    decoded_filepath.resize(url.length());
    decode_url(decoded_filepath.begin(), url.data());

    return decoded_filepath;
}